

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O1

char * __thiscall Formula_Constraint::Get_Name(Formula_Constraint *this)

{
  return (char *)0x0;
}

Assistant:

const char *
Formula_Constraint::Get_Name()
{
#ifdef DEBUG
  Formula_Constraint *me = (Formula_Constraint *)this;
  return me->formula_name;
#else
  return nullptr; //no name if not debugging
#endif
}